

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

uint32 __thiscall
Wasm::WasmBytecodeGenerator::WriteTypeStackToString
          (WasmBytecodeGenerator *this,char16 *out,uint32 maxlen)

{
  code *pcVar1;
  anon_class_24_3_b7e35369 writefn;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  int local_3c;
  int i;
  uint local_20;
  uint32 local_1c;
  uint32 numwritten;
  uint32 maxlen_local;
  char16 *out_local;
  WasmBytecodeGenerator *this_local;
  
  local_1c = maxlen;
  _numwritten = out;
  out_local = (char16 *)this;
  if (out == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x37,"(out != nullptr)","out != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_20 = 0;
  writefn.out = (char16 **)&numwritten;
  writefn.numwritten = &local_20;
  writefn.maxlen = &local_1c;
  WriteTypeStack<Wasm::WasmBytecodeGenerator::WriteTypeStackToString(char16_t*,unsigned_int)const::__0>
            (this,writefn);
  if (local_1c - 5 <= local_20) {
    for (local_3c = 1; local_3c < 6; local_3c = local_3c + 1) {
      _numwritten[(ulong)local_1c - (long)local_3c] = L'\0';
    }
    local_20 = local_20 - 5;
    iVar3 = _snwprintf_unsafe(_numwritten + local_20,(ulong)(local_1c - local_20),0xffffffffffffffff
                              ,L"...]");
    local_20 = iVar3 + local_20;
  }
  return local_20;
}

Assistant:

uint32 WasmBytecodeGenerator::WriteTypeStackToString(_Out_writes_(maxlen) char16* out, uint32 maxlen) const
{
    AssertOrFailFast(out != nullptr);
    uint32 numwritten = 0;
    WriteTypeStack([&] (const char16* msg)
    {
        numwritten += _snwprintf_s(out + numwritten, maxlen - numwritten, _TRUNCATE, msg);
    });
    if (numwritten >= maxlen - 5)
    {
        // null out the last 5 characters so we can properly end it
        for (int i = 1; i <= 5; i++)
        {
            *(out + maxlen - i) = 0;
        }
        numwritten -= 5;
        numwritten += _snwprintf_s(out + numwritten, maxlen - numwritten, _TRUNCATE, _u("...]"));
    }
    return numwritten;
}